

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cClipDistance.cpp
# Opt level: O2

void __thiscall
gl3cts::ClipDistance::Utility::Framebuffer::Framebuffer
          (Framebuffer *this,Functions *gl,GLsizei size_x,GLsizei size_y)

{
  GLenum GVar1;
  
  this->m_gl = gl;
  this->m_size_x = size_x;
  this->m_size_y = size_y;
  this->m_framebuffer_id = 0;
  this->m_renderbuffer_id = 0;
  (*gl->genFramebuffers)(1,&this->m_framebuffer_id);
  GVar1 = (*this->m_gl->getError)();
  glu::checkError(GVar1,"glGenFramebuffers call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.cpp"
                  ,0x5bd);
  (*this->m_gl->genRenderbuffers)(1,&this->m_renderbuffer_id);
  GVar1 = (*this->m_gl->getError)();
  glu::checkError(GVar1,"glGenRenderbuffers call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.cpp"
                  ,0x5c0);
  (*this->m_gl->bindFramebuffer)(0x8d40,this->m_framebuffer_id);
  GVar1 = (*this->m_gl->getError)();
  glu::checkError(GVar1,"glBindFramebuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.cpp"
                  ,0x5c3);
  (*this->m_gl->bindRenderbuffer)(0x8d41,this->m_renderbuffer_id);
  GVar1 = (*this->m_gl->getError)();
  glu::checkError(GVar1,"glBindRenderbuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.cpp"
                  ,0x5c6);
  (*this->m_gl->renderbufferStorage)(0x8d41,0x822e,this->m_size_x,this->m_size_y);
  GVar1 = (*this->m_gl->getError)();
  glu::checkError(GVar1,"glRenderbufferStorage call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.cpp"
                  ,0x5c9);
  (*this->m_gl->framebufferRenderbuffer)(0x8d40,0x8ce0,0x8d41,this->m_renderbuffer_id);
  GVar1 = (*this->m_gl->getError)();
  glu::checkError(GVar1,"glFramebufferRenderbuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.cpp"
                  ,0x5cc);
  GVar1 = (*gl->checkFramebufferStatus)(0x8d40);
  if (GVar1 == 0x8cd5) {
    return;
  }
  (*this->m_gl->deleteFramebuffers)(1,&this->m_framebuffer_id);
  this->m_framebuffer_id = 0;
  (*this->m_gl->deleteRenderbuffers)(1,&this->m_renderbuffer_id);
  this->m_renderbuffer_id = 0;
  GVar1 = (*this->m_gl->getError)();
  glu::checkError(GVar1,"glDeleteRenderbuffers call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.cpp"
                  ,0x5d5);
  GVar1 = (*this->m_gl->getError)();
  glu::checkError(GVar1,"glDeleteFramebuffers call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.cpp"
                  ,0x5d6);
  return;
}

Assistant:

gl3cts::ClipDistance::Utility::Framebuffer::Framebuffer(const glw::Functions& gl, const glw::GLsizei size_x,
														const glw::GLsizei size_y)
	: m_gl(gl), m_size_x(size_x), m_size_y(size_y), m_framebuffer_id(0), m_renderbuffer_id(0)
{
	m_gl.genFramebuffers(1, &m_framebuffer_id);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glGenFramebuffers call failed.");

	m_gl.genRenderbuffers(1, &m_renderbuffer_id);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glGenRenderbuffers call failed.");

	m_gl.bindFramebuffer(GL_FRAMEBUFFER, m_framebuffer_id);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBindFramebuffer call failed.");

	m_gl.bindRenderbuffer(GL_RENDERBUFFER, m_renderbuffer_id);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBindRenderbuffer call failed.");

	m_gl.renderbufferStorage(GL_RENDERBUFFER, GL_R32F, m_size_x, m_size_y);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glRenderbufferStorage call failed.");

	m_gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, m_renderbuffer_id);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glFramebufferRenderbuffer call failed.");

	if (gl.checkFramebufferStatus(GL_FRAMEBUFFER) != GL_FRAMEBUFFER_COMPLETE)
	{
		m_gl.deleteFramebuffers(1, &m_framebuffer_id);
		m_framebuffer_id = 0;

		m_gl.deleteRenderbuffers(1, &m_renderbuffer_id);
		m_renderbuffer_id = 0;
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glDeleteRenderbuffers call failed.");
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glDeleteFramebuffers call failed.");
	}
}